

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ExpressionLhs<const_xll::expected<double,_int>_&>::endExpression
          (ExpressionLhs<const_xll::expected<double,_int>_&> *this)

{
  ResultBuilder *this_00;
  size_t sVar1;
  OfType OVar2;
  bool in_DL;
  string sStack_38;
  
  this_00 = this->m_rb;
  sVar1 = (this->m_lhs->_value)._storage._which;
  Catch::toString_abi_cxx11_(&sStack_38,(Catch *)(ulong)(sVar1 == 1),in_DL);
  std::__cxx11::string::_M_assign((string *)&(this_00->m_exprComponents).lhs);
  OVar2 = ExpressionFailed;
  if (sVar1 == 1) {
    OVar2 = Ok;
  }
  (this_00->m_data).resultType = OVar2;
  ResultBuilder::endExpression(this_00);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void endExpression() {
        bool value = m_lhs ? true : false;
        m_rb
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression();
    }